

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::AddPropagateStatistics::Operation<signed_char,duckdb::TryAddOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  Value local_70;
  
  cVar1 = NumericStats::GetMin<signed_char>(lstats);
  cVar2 = NumericStats::GetMin<signed_char>(rstats);
  cVar4 = (char)((short)cVar2 + (short)cVar1);
  bVar5 = true;
  if ((short)cVar4 == (short)((short)cVar2 + (short)cVar1)) {
    cVar1 = NumericStats::GetMax<signed_char>(lstats);
    cVar2 = NumericStats::GetMax<signed_char>(rstats);
    cVar3 = (char)((short)cVar2 + (short)cVar1);
    if ((short)cVar3 == (short)((short)cVar2 + (short)cVar1)) {
      Value::Numeric(&local_70,type,(long)cVar4);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,(long)cVar3);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}